

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O3

TonkFile tonk_file_from_buffer
                   (TonkConnection connection,uint32_t channel,char *name,void *data,uint32_t bytes,
                   uint32_t flags)

{
  TonkFile pTVar1;
  
  if (fp_tonk_file_from_buffer != (fp_tonk_file_from_buffer_t)0x0) {
    pTVar1 = (*fp_tonk_file_from_buffer)(connection,channel,name,data,bytes,flags);
    return pTVar1;
  }
  return (TonkFile)0x0;
}

Assistant:

TonkFile tonk_file_from_buffer(
    TonkConnection connection,  ///< Connection to send on
    uint32_t          channel,  ///< Reliable channel for data
    const char*          name,  ///< Transfer name
    const void*          data,  ///< File buffer data pointer
    uint32_t            bytes,  ///< File buffer bytes to send
    uint32_t            flags   ///< Flags for buffer
)
{
    if (!fp_tonk_file_from_buffer) {
        return 0;
    }

    return fp_tonk_file_from_buffer(
        connection,
        channel,
        name,
        data,
        bytes,
        flags);
}